

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O0

void __thiscall
stateObservation::ZeroDelayObserver::setInput(ZeroDelayObserver *this,InputVector *u_k,uint k)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  Matrix<double,__1,__1,_0,__1,__1> local_38;
  uint local_1c;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pEStack_18;
  uint k_local;
  InputVector *u_k_local;
  ZeroDelayObserver *this_local;
  
  if ((this->super_ObserverBase).p_ == 0) {
    return;
  }
  local_1c = k;
  pEStack_18 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_k;
  u_k_local = (InputVector *)this;
  uVar3 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x1b])(this,u_k);
  if ((uVar3 & 1) == 0) {
    __assert_fail("checkInputVector(u_k) && \"The size of the input vector is incorrect\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x3b,
                  "virtual void stateObservation::ZeroDelayObserver::setInput(const ObserverBase::InputVector &, unsigned int)"
                 );
  }
  uVar3 = IndexedMatrixArray::size(&this->u_);
  if (uVar3 == 0) {
    bVar2 = IndexedMatrix::isSet(&this->x_);
    if ((bVar2) && (uVar3 = IndexedMatrix::getTime(&this->x_), uVar3 != local_1c)) {
      uVar3 = IndexedMatrix::getTime(&this->x_);
      bVar2 = false;
      if (uVar3 == local_1c - 1) goto LAB_004e16ab;
    }
    else {
LAB_004e16ab:
      bVar2 = true;
    }
    if (!bVar2) {
      __assert_fail("(!x_.isSet() || x_.getTime()==k || x_.getTime()==k-1) && \"ERROR: The time is set incorrectly for the                           inputs (must be [current_time] or [current_time+1])\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/zero-delay-observer.cpp"
                    ,0x45,
                    "virtual void stateObservation::ZeroDelayObserver::setInput(const ObserverBase::InputVector &, unsigned int)"
                   );
    }
    goto LAB_004e16de;
  }
  uVar3 = IndexedMatrixArray::getLastIndex(&this->u_);
  if (uVar3 == local_1c - 1) {
LAB_004e1635:
    bVar2 = true;
  }
  else {
    bVar1 = IndexedMatrixArray::checkIndex(&this->u_,local_1c);
    bVar2 = false;
    if (bVar1) goto LAB_004e1635;
  }
  if (!bVar2) {
    __assert_fail("(u_.getLastIndex()==k-1 || u_.checkIndex(k)) && \"ERROR: The time is set incorrectly                                 for the inputs (order or gap)\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x40,
                  "virtual void stateObservation::ZeroDelayObserver::setInput(const ObserverBase::InputVector &, unsigned int)"
                 );
  }
LAB_004e16de:
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_38,pEStack_18);
  IndexedMatrixArray::setValue(&this->u_,(Matrix *)&local_38,local_1c);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_38);
  return;
}

Assistant:

void ZeroDelayObserver::setInput
                    (const ObserverBase::InputVector& u_k,unsigned k)
    {
        if (p_>0)
        {
            BOOST_ASSERT(checkInputVector(u_k)
                        && "The size of the input vector is incorrect");

            if (u_.size()>0)
                BOOST_ASSERT ((u_.getLastIndex()==k-1 || u_.checkIndex(k))
                        && "ERROR: The time is set incorrectly \
                                for the inputs (order or gap)");
            else
            {
                BOOST_ASSERT ( (!x_.isSet() || x_.getTime()==k || x_.getTime()==k-1)
                    && "ERROR: The time is set incorrectly for the \
                          inputs (must be [current_time] or [current_time+1])");
            }

            u_.setValue(u_k,k);
        }
    }